

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InverseKinematics.cpp
# Opt level: O3

bool __thiscall iDynTree::InverseKinematics::solve(InverseKinematics *this)

{
  iDynTree::reportError
            ("InverseKinematics","",
             "IDYNTREE_USES_IPOPT CMake option need to be set to ON to use InverseKinematics");
  return false;
}

Assistant:

bool InverseKinematics::solve()
    {
#ifdef IDYNTREE_USES_IPOPT
        assert(m_pimpl);
        return IK_PIMPL(m_pimpl)->solveProblem();
#else
        return missingIpoptErrorReport();
#endif
    }